

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

Extension * __thiscall
google::protobuf::internal::ExtensionSet::FindOrNull(ExtensionSet *this,int key)

{
  KeyValue *pKVar1;
  Extension *pEVar2;
  KeyValue *pKVar3;
  int local_c;
  
  local_c = key;
  if (0x100 < this->flat_capacity_) {
    pEVar2 = FindOrNullInLargeMap(this,key);
    return pEVar2;
  }
  pKVar3 = (this->map_).flat + this->flat_size_;
  pKVar1 = std::
           __lower_bound<google::protobuf::internal::ExtensionSet::KeyValue_const*,int,__gnu_cxx::__ops::_Iter_comp_val<google::protobuf::internal::ExtensionSet::KeyValue::FirstComparator>>
                     ((this->map_).flat,pKVar3,&local_c);
  if (pKVar1 == pKVar3) {
    pEVar2 = (Extension *)0x0;
  }
  else {
    pEVar2 = (Extension *)0x0;
    if (pKVar1->first == local_c) {
      pEVar2 = &pKVar1->second;
    }
  }
  return pEVar2;
}

Assistant:

const ExtensionSet::Extension* ExtensionSet::FindOrNull(int key) const {
  if (PROTOBUF_PREDICT_FALSE(is_large())) {
    return FindOrNullInLargeMap(key);
  }
  const KeyValue* end = flat_end();
  const KeyValue* it =
      std::lower_bound(flat_begin(), end, key, KeyValue::FirstComparator());
  if (it != end && it->first == key) {
    return &it->second;
  }
  return NULL;
}